

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void encode_rd_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                 int mi_row,int mi_col,int seg_skip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PC_TREE *pPVar4;
  SIMPLE_MOTION_DATA_TREE *sms_tree;
  void *pvVar5;
  SIMPLE_MOTION_DATA_TREE *in_RCX;
  ThreadData_conflict *in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  int backup_current_qindex;
  int alloc_mi_idx;
  int best_qp_diff;
  int num_passes;
  SuperBlockEnc *sb_enc;
  BLOCK_SIZE bsize;
  SIMPLE_MOTION_DATA_TREE *sms_root;
  RD_STATS dummy_rdc;
  int64_t dummy_dist;
  int dummy_rate;
  int num_planes;
  BLOCK_SIZE sb_size;
  MB_MODE_INFO **mi;
  TileInfo *tile_info;
  SPEED_FEATURES *sf;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  int in_stack_000001f0;
  int in_stack_000001f4;
  MACROBLOCK *in_stack_000001f8;
  ThreadData_conflict *in_stack_00000200;
  TileInfo *in_stack_00000208;
  AV1_COMP *in_stack_00000210;
  int in_stack_0000021c;
  TokenExtra **in_stack_00000220;
  MB_MODE_INFO **in_stack_00000228;
  TileDataEnc *in_stack_00000230;
  ThreadData_conflict *in_stack_00000238;
  AV1_COMP *in_stack_00000240;
  int in_stack_00000248;
  int in_stack_0000024c;
  TokenExtra **in_stack_00000250;
  TileDataEnc *in_stack_00000258;
  ThreadData_conflict *in_stack_00000260;
  AV1_COMP *in_stack_00000268;
  int in_stack_00000270;
  BLOCK_SIZE in_stack_00000278;
  int *in_stack_00000280;
  int64_t *in_stack_00000288;
  int in_stack_00000290;
  PC_TREE *in_stack_00000298;
  BLOCK_SIZE in_stack_000002a0;
  RD_STATS *in_stack_000002a8;
  RD_STATS in_stack_000002b0;
  PC_TREE *in_stack_000002d8;
  SIMPLE_MOTION_DATA_TREE *in_stack_000002e0;
  int64_t *in_stack_000002e8;
  SB_MULTI_PASS_MODE in_stack_000002f0;
  RD_RECT_PART_WIN_INFO *in_stack_000002f8;
  uint local_168;
  BLOCK_SIZE in_stack_fffffffffffffe9f;
  undefined8 in_stack_fffffffffffffea0;
  SIMPLE_MOTION_DATA_TREE *pSVar6;
  ThreadData_conflict *pTVar7;
  undefined1 *puVar8;
  undefined8 in_stack_fffffffffffffeb0;
  int iVar9;
  TileDataEnc *in_stack_fffffffffffffeb8;
  TileDataEnc *pTVar10;
  ThreadData_conflict *in_stack_fffffffffffffec0;
  ThreadData_conflict *pTVar11;
  AV1_COMP *in_stack_fffffffffffffec8;
  ThreadData_conflict *in_stack_fffffffffffffed0;
  BLOCK_SIZE bsize_00;
  SB_FIRST_PASS_STATS *sb_fp_stats;
  AV1_COMP *in_stack_fffffffffffffed8;
  ThreadData_conflict *td_00;
  MACROBLOCK *in_stack_fffffffffffffee0;
  TileDataEnc *tile_data_00;
  int in_stack_fffffffffffffee8;
  undefined4 uVar12;
  int in_stack_fffffffffffffeec;
  AV1_COMP *in_stack_fffffffffffffef0;
  AV1_COMP *pAVar13;
  TileInfo *in_stack_fffffffffffffef8;
  int mi_col_00;
  AV1_COMP *in_stack_ffffffffffffff00;
  SuperBlockEnc *in_stack_ffffffffffffff08;
  MACROBLOCK *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  AV1_COMP *pAVar14;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  AV1_COMP *in_stack_ffffffffffffff50;
  undefined8 uStack_a8;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  AV1_COMP *in_stack_ffffffffffffff70;
  undefined1 local_88 [8];
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar15;
  
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  iVar9 = (int)&local_168;
  pAVar13 = (AV1_COMP *)&in_RDI->sf;
  pAVar14 = (AV1_COMP *)(in_RDI->common).mi_params.mi_grid_base;
  pTVar11 = in_RDX;
  iVar1 = get_mi_grid_idx(&(in_RDI->common).mi_params,in_R8D,in_R9D);
  pTVar10 = (TileDataEnc *)
            ((long)((pAVar14->enc_quant_dequant_params).quants.y_quant + -1) + (long)iVar1 * 8);
  uVar15 = CONCAT13(((in_RDI->common).seq_params)->sb_size,(int3)in_stack_ffffffffffffff8c);
  iVar1 = av1_num_planes(&in_RDI->common);
  td_00 = *(ThreadData_conflict **)(in_RSI + 0x25cb0);
  pSVar6 = (SIMPLE_MOTION_DATA_TREE *)CONCAT44(uVar12,1);
  init_encode_rd_sb(in_stack_fffffffffffffef0,
                    (ThreadData_conflict *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    (TileDataEnc *)in_stack_fffffffffffffee0,
                    (SIMPLE_MOTION_DATA_TREE *)in_stack_fffffffffffffed8,
                    (RD_STATS *)in_stack_fffffffffffffed0,
                    (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_ffffffffffffff00,
                    (int)in_stack_ffffffffffffff08);
  bsize_00 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if ((char)(pAVar13->enc_quant_dequant_params).quants.y_quant[8][0] == '\x02') {
    av1_set_offsets(in_stack_fffffffffffffef0,
                    (TileInfo *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee0,iVar2,(int)in_stack_fffffffffffffed8,bsize_00);
    iVar2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    iVar1 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    av1_choose_var_based_partitioning
              (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8,
               in_stack_000001f4,in_stack_000001f0);
    pPVar4 = av1_alloc_pc_tree_node(in_stack_fffffffffffffe9f);
    *(PC_TREE **)(in_RSI + 0x26e50) = pPVar4;
    local_168 = in_R9D;
    if (*(long *)(in_RSI + 0x26e50) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
      local_168 = in_R9D;
    }
    pPVar4 = *(PC_TREE **)(in_RSI + 0x26e50);
    puVar8 = local_88;
    iVar9 = 1;
    av1_rd_use_partition
              (in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
               in_stack_00000220,in_stack_0000021c,in_stack_00000270,in_stack_00000278,
               in_stack_00000280,in_stack_00000288,in_stack_00000290,in_stack_00000298);
    av1_free_pc_tree_recursive
              (pPVar4,iVar1,iVar9,(int)((ulong)puVar8 >> 0x20),
               (PARTITION_SEARCH_TYPE)((ulong)puVar8 >> 0x18));
    *(undefined8 *)(in_RSI + 0x26e50) = 0;
  }
  else if (((char)(pAVar13->enc_quant_dequant_params).quants.y_quant[8][0] == '\x01') ||
          (in_stack_00000008 != 0)) {
    av1_set_offsets(in_stack_fffffffffffffef0,
                    (TileInfo *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee0,iVar2,(int)in_stack_fffffffffffffed8,bsize_00);
    iVar2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    iVar1 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    av1_set_fixed_partitioning
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (MB_MODE_INFO **)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee8,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffee0 >> 0x38));
    pPVar4 = av1_alloc_pc_tree_node(in_stack_fffffffffffffe9f);
    *(PC_TREE **)(in_RSI + 0x26e50) = pPVar4;
    local_168 = in_R9D;
    if (*(long *)(in_RSI + 0x26e50) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
      local_168 = in_R9D;
    }
    pPVar4 = *(PC_TREE **)(in_RSI + 0x26e50);
    puVar8 = local_88;
    iVar9 = 1;
    av1_rd_use_partition
              (in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
               in_stack_00000220,in_stack_0000021c,in_stack_00000270,in_stack_00000278,
               in_stack_00000280,in_stack_00000288,in_stack_00000290,in_stack_00000298);
    av1_free_pc_tree_recursive
              (pPVar4,iVar1,iVar9,(int)((ulong)puVar8 >> 0x20),
               (PARTITION_SEARCH_TYPE)((ulong)puVar8 >> 0x18));
    *(undefined8 *)(in_RSI + 0x26e50) = 0;
  }
  else {
    sms_tree = (SIMPLE_MOTION_DATA_TREE *)(in_RSI + 0x15250);
    av1_get_tpl_stats_sb
              (pAVar14,(BLOCK_SIZE)((uint)in_stack_ffffffffffffff1c >> 0x18),
               in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               in_stack_ffffffffffffff08);
    av1_reset_simple_motion_tree_partition(pSVar6,in_stack_fffffffffffffe9f);
    set_max_min_partition_size
              ((SuperBlockEnc *)pAVar14,
               (AV1_COMP *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,(SPEED_FEATURES *)in_stack_ffffffffffffff08,
               (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),(int)in_stack_ffffffffffffff00
               ,in_stack_ffffffffffffff30);
    mi_col_00 = (int)in_stack_ffffffffffffff00;
    iVar2 = 1;
    if ((in_RDI->oxcf).unit_test_cfg.sb_multipass_unit_test != 0) {
      iVar2 = 2;
    }
    if ((((in_RDI->oxcf).sb_qp_sweep != 0) &&
        (((iVar3 = has_no_stats_stage(in_RDI), iVar3 == 0 || ((in_RDI->oxcf).mode != '\x01')) ||
         ((in_RDI->oxcf).gf_cfg.lag_in_frames != 0)))) &&
       ((in_RDI->common).delta_q_info.delta_q_present_flag != 0)) {
      pvVar5 = aom_malloc(0x1f9d0c);
      *(void **)(in_RSI + 0x25698) = pvVar5;
      pTVar7 = td_00;
      if (*(long *)(in_RSI + 0x25698) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate td->mb.sb_stats_cache");
        pTVar7 = td_00;
      }
      av1_backup_sb_state((SB_FIRST_PASS_STATS *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                          ,in_stack_fffffffffffffed0,(TileDataEnc *)in_stack_fffffffffffffec8,
                          (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                          (int)in_stack_fffffffffffffec0);
      local_168 = uVar15 >> 0x18;
      td_00 = pTVar7;
      iVar1 = sb_qp_sweep(pAVar13,in_RDX,pTVar10,(TokenExtra **)CONCAT44(uVar15,iVar1),
                          in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,(BLOCK_SIZE)in_R9D,
                          in_RCX,(SB_FIRST_PASS_STATS *)pTVar11);
      iVar1 = iVar1 - *(int *)(in_RSI + 0x4210);
      pvVar5 = (void *)CONCAT44((int)((ulong)pTVar7 >> 0x20),iVar1);
      sb_qp_sweep_init_quantizers
                (in_stack_ffffffffffffff50,td_00,
                 (TileDataEnc *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 sms_tree,(RD_STATS *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
      iVar3 = get_alloc_mi_idx(&(in_RDI->common).mi_params,in_R8D,in_R9D);
      iVar1 = (in_RDI->common).mi_params.mi_alloc[iVar3].current_qindex;
      av1_reset_mbmi((CommonModeInfoParams *)in_stack_fffffffffffffec0,
                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                     (int)in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20))
      ;
      av1_restore_sb_state
                ((SB_FIRST_PASS_STATS *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0);
      (in_RDI->common).mi_params.mi_alloc[iVar3].current_qindex = iVar1;
      aom_free(pvVar5);
      *(undefined8 *)(in_RSI + 0x25698) = 0;
    }
    if (iVar2 == 1) {
      pPVar4 = av1_alloc_pc_tree_node(in_stack_fffffffffffffe9f);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      *(PC_TREE **)(in_RSI + 0x26e50) = pPVar4;
      if (*(long *)(in_RSI + 0x26e50) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
      local_168 = uVar15 >> 0x18;
      in_stack_fffffffffffffed0 = *(ThreadData_conflict **)(in_RSI + 0x26e50);
      av1_rd_pick_partition
                (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
                 in_stack_0000024c,in_stack_00000248,in_stack_000002a0,in_stack_000002a8,
                 in_stack_000002b0,in_stack_000002d8,in_stack_000002e0,in_stack_000002e8,
                 in_stack_000002f0,in_stack_000002f8);
    }
    else {
      pvVar5 = aom_malloc(0x1fa08d);
      *(void **)(in_RSI + 0x256a0) = pvVar5;
      if (*(long *)(in_RSI + 0x256a0) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate td->mb.sb_fp_stats");
      }
      av1_backup_sb_state((SB_FIRST_PASS_STATS *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                          ,in_stack_fffffffffffffed0,(TileDataEnc *)in_stack_fffffffffffffec8,
                          (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                          (int)in_stack_fffffffffffffec0);
      pPVar4 = av1_alloc_pc_tree_node(in_stack_fffffffffffffe9f);
      *(PC_TREE **)(in_RSI + 0x26e50) = pPVar4;
      if (*(long *)(in_RSI + 0x26e50) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
      local_168 = uVar15 >> 0x18;
      sb_fp_stats = *(SB_FIRST_PASS_STATS **)(in_RSI + 0x26e50);
      pTVar10 = (TileDataEnc *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      pTVar11 = (ThreadData_conflict *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
      ;
      puVar8 = &stack0xffffffffffffff50;
      pAVar13 = (AV1_COMP *)0x0;
      uVar12 = 1;
      tile_data_00 = (TileDataEnc *)0x0;
      pAVar14 = in_stack_ffffffffffffff70;
      av1_rd_pick_partition
                (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
                 in_stack_0000024c,in_stack_00000248,in_stack_000002a0,in_stack_000002a8,
                 in_stack_000002b0,in_stack_000002d8,in_stack_000002e0,in_stack_000002e8,
                 in_stack_000002f0,in_stack_000002f8);
      iVar2 = (int)((ulong)pAVar14 >> 0x20);
      pSVar6 = (SIMPLE_MOTION_DATA_TREE *)((ulong)puVar8 & 0xffffffff00000000);
      init_encode_rd_sb(pAVar13,(ThreadData_conflict *)CONCAT44(in_stack_fffffffffffffeec,uVar12),
                        tile_data_00,(SIMPLE_MOTION_DATA_TREE *)td_00,(RD_STATS *)sb_fp_stats,
                        (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),mi_col_00,iVar9);
      av1_reset_mbmi((CommonModeInfoParams *)pTVar11,(BLOCK_SIZE)((ulong)pTVar10 >> 0x38),
                     (int)pTVar10,(int)((ulong)uStack_a8 >> 0x20));
      av1_reset_simple_motion_tree_partition(pSVar6,in_stack_fffffffffffffe9f);
      av1_restore_sb_state
                (sb_fp_stats,in_stack_ffffffffffffff70,pTVar11,pTVar10,
                 (int)((ulong)uStack_a8 >> 0x20),(int)uStack_a8);
      pPVar4 = av1_alloc_pc_tree_node(in_stack_fffffffffffffe9f);
      *(PC_TREE **)(in_RSI + 0x26e50) = pPVar4;
      if (*(long *)(in_RSI + 0x26e50) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
      local_168 = uVar15 >> 0x18;
      in_stack_fffffffffffffed0 = *(ThreadData_conflict **)(in_RSI + 0x26e50);
      puVar8 = &stack0xffffffffffffff50;
      av1_rd_pick_partition
                (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
                 in_stack_0000024c,in_stack_00000248,in_stack_000002a0,in_stack_000002a8,
                 in_stack_000002b0,in_stack_000002d8,in_stack_000002e0,in_stack_000002e8,
                 in_stack_000002f0,in_stack_000002f8);
      aom_free(puVar8);
      *(undefined8 *)(in_RSI + 0x256a0) = 0;
    }
    *(undefined4 *)&sms_tree->field_0x4 = 0;
  }
  if ((((in_RDI->sf).inter_sf.inter_mode_rd_model_estimation == 1) &&
      ((in_RDI->common).tiles.cols == 1)) && ((in_RDI->common).tiles.rows == 1)) {
    av1_inter_mode_data_fit((TileDataEnc *)in_stack_fffffffffffffed0,iVar2);
  }
  return;
}

Assistant:

static inline void encode_rd_sb(AV1_COMP *cpi, ThreadData *td,
                                TileDataEnc *tile_data, TokenExtra **tp,
                                const int mi_row, const int mi_col,
                                const int seg_skip) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const SPEED_FEATURES *const sf = &cpi->sf;
  const TileInfo *const tile_info = &tile_data->tile_info;
  MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                      get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  const int num_planes = av1_num_planes(cm);
  int dummy_rate;
  int64_t dummy_dist;
  RD_STATS dummy_rdc;
  SIMPLE_MOTION_DATA_TREE *const sms_root = td->sms_root;

#if CONFIG_REALTIME_ONLY
  (void)seg_skip;
#endif  // CONFIG_REALTIME_ONLY

  init_encode_rd_sb(cpi, td, tile_data, sms_root, &dummy_rdc, mi_row, mi_col,
                    1);

  // Encode the superblock
  if (sf->part_sf.partition_search_type == VAR_BASED_PARTITION) {
    // partition search starting from a variance-based partition
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
    av1_choose_var_based_partitioning(cpi, tile_info, td, x, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, rd_use_partition_time);
#endif
    td->pc_root = av1_alloc_pc_tree_node(sb_size);
    if (!td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    av1_rd_use_partition(cpi, td, tile_data, mi, tp, mi_row, mi_col, sb_size,
                         &dummy_rate, &dummy_dist, 1, td->pc_root);
    av1_free_pc_tree_recursive(td->pc_root, num_planes, 0, 0,
                               sf->part_sf.partition_search_type);
    td->pc_root = NULL;
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, rd_use_partition_time);
#endif
  }
#if !CONFIG_REALTIME_ONLY
  else if (sf->part_sf.partition_search_type == FIXED_PARTITION || seg_skip) {
    // partition search by adjusting a fixed-size partition
    av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
    const BLOCK_SIZE bsize =
        seg_skip ? sb_size : sf->part_sf.fixed_partition_size;
    av1_set_fixed_partitioning(cpi, tile_info, mi, mi_row, mi_col, bsize);
    td->pc_root = av1_alloc_pc_tree_node(sb_size);
    if (!td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    av1_rd_use_partition(cpi, td, tile_data, mi, tp, mi_row, mi_col, sb_size,
                         &dummy_rate, &dummy_dist, 1, td->pc_root);
    av1_free_pc_tree_recursive(td->pc_root, num_planes, 0, 0,
                               sf->part_sf.partition_search_type);
    td->pc_root = NULL;
  } else {
    // The most exhaustive recursive partition search
    SuperBlockEnc *sb_enc = &x->sb_enc;
    // No stats for overlay frames. Exclude key frame.
    av1_get_tpl_stats_sb(cpi, sb_size, mi_row, mi_col, sb_enc);

    // Reset the tree for simple motion search data
    av1_reset_simple_motion_tree_partition(sms_root, sb_size);

#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, rd_pick_partition_time);
#endif

    // Estimate the maximum square partition block size, which will be used
    // as the starting block size for partitioning the sb
    set_max_min_partition_size(sb_enc, cpi, x, sf, sb_size, mi_row, mi_col);

    // The superblock can be searched only once, or twice consecutively for
    // better quality. Note that the meaning of passes here is different from
    // the general concept of 1-pass/2-pass encoders.
    const int num_passes =
        cpi->oxcf.unit_test_cfg.sb_multipass_unit_test ? 2 : 1;

    if (cpi->oxcf.sb_qp_sweep &&
        !(has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
          cpi->oxcf.gf_cfg.lag_in_frames == 0) &&
        cm->delta_q_info.delta_q_present_flag) {
      AOM_CHECK_MEM_ERROR(
          x->e_mbd.error_info, td->mb.sb_stats_cache,
          (SB_FIRST_PASS_STATS *)aom_malloc(sizeof(*td->mb.sb_stats_cache)));
      av1_backup_sb_state(td->mb.sb_stats_cache, cpi, td, tile_data, mi_row,
                          mi_col);
      assert(x->rdmult_delta_qindex == x->delta_qindex);

      const int best_qp_diff =
          sb_qp_sweep(cpi, td, tile_data, tp, mi_row, mi_col, sb_size, sms_root,
                      td->mb.sb_stats_cache) -
          x->rdmult_delta_qindex;

      sb_qp_sweep_init_quantizers(cpi, td, tile_data, sms_root, &dummy_rdc,
                                  mi_row, mi_col, best_qp_diff);

      const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
      const int backup_current_qindex =
          cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex;

      av1_reset_mbmi(&cm->mi_params, sb_size, mi_row, mi_col);
      av1_restore_sb_state(td->mb.sb_stats_cache, cpi, td, tile_data, mi_row,
                           mi_col);

      cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex =
          backup_current_qindex;
      aom_free(td->mb.sb_stats_cache);
      td->mb.sb_stats_cache = NULL;
    }
    if (num_passes == 1) {
#if CONFIG_PARTITION_SEARCH_ORDER
      if (cpi->ext_part_controller.ready && !frame_is_intra_only(cm)) {
        av1_reset_part_sf(&cpi->sf.part_sf);
        av1_reset_sf_for_ext_part(cpi);
        RD_STATS this_rdc;
        av1_rd_partition_search(cpi, td, tile_data, tp, sms_root, mi_row,
                                mi_col, sb_size, &this_rdc);
      } else {
        td->pc_root = av1_alloc_pc_tree_node(sb_size);
        if (!td->pc_root)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PC_TREE");
        av1_rd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col, sb_size,
                              &dummy_rdc, dummy_rdc, td->pc_root, sms_root,
                              NULL, SB_SINGLE_PASS, NULL);
      }
#else
      td->pc_root = av1_alloc_pc_tree_node(sb_size);
      if (!td->pc_root)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      av1_rd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col, sb_size,
                            &dummy_rdc, dummy_rdc, td->pc_root, sms_root, NULL,
                            SB_SINGLE_PASS, NULL);
#endif  // CONFIG_PARTITION_SEARCH_ORDER
    } else {
      // First pass
      AOM_CHECK_MEM_ERROR(
          x->e_mbd.error_info, td->mb.sb_fp_stats,
          (SB_FIRST_PASS_STATS *)aom_malloc(sizeof(*td->mb.sb_fp_stats)));
      av1_backup_sb_state(td->mb.sb_fp_stats, cpi, td, tile_data, mi_row,
                          mi_col);
      td->pc_root = av1_alloc_pc_tree_node(sb_size);
      if (!td->pc_root)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      av1_rd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col, sb_size,
                            &dummy_rdc, dummy_rdc, td->pc_root, sms_root, NULL,
                            SB_DRY_PASS, NULL);

      // Second pass
      init_encode_rd_sb(cpi, td, tile_data, sms_root, &dummy_rdc, mi_row,
                        mi_col, 0);
      av1_reset_mbmi(&cm->mi_params, sb_size, mi_row, mi_col);
      av1_reset_simple_motion_tree_partition(sms_root, sb_size);

      av1_restore_sb_state(td->mb.sb_fp_stats, cpi, td, tile_data, mi_row,
                           mi_col);

      td->pc_root = av1_alloc_pc_tree_node(sb_size);
      if (!td->pc_root)
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      av1_rd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col, sb_size,
                            &dummy_rdc, dummy_rdc, td->pc_root, sms_root, NULL,
                            SB_WET_PASS, NULL);
      aom_free(td->mb.sb_fp_stats);
      td->mb.sb_fp_stats = NULL;
    }

    // Reset to 0 so that it wouldn't be used elsewhere mistakenly.
    sb_enc->tpl_data_count = 0;
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, rd_pick_partition_time);
#endif
  }
#endif  // !CONFIG_REALTIME_ONLY

  // Update the inter rd model
  // TODO(angiebird): Let inter_mode_rd_model_estimation support multi-tile.
  if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1 &&
      cm->tiles.cols == 1 && cm->tiles.rows == 1) {
    av1_inter_mode_data_fit(tile_data, x->rdmult);
  }
}